

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isupper.c
# Opt level: O3

int main(void)

{
  _PDCLIB_lc_ctype_entry_t *p_Var1;
  
  p_Var1 = _PDCLIB_lc_ctype->entry;
  if ((p_Var1[0x41].flags & 0x80) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1a,"isupper( \'A\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x5a].flags & 0x80) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1b,"isupper( \'Z\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x61].flags & 0x80) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1c,"! isupper( \'a\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x7a].flags & 0x80) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1d,"! isupper( \'z\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x20].flags & 0x80) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1e,"! isupper( \' \' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x40].flags & 0x80) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isupper.c, line %d - %s\n"
           ,0x1f,"! isupper( \'@\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isupper( 'A' ) );
    TESTCASE( isupper( 'Z' ) );
    TESTCASE( ! isupper( 'a' ) );
    TESTCASE( ! isupper( 'z' ) );
    TESTCASE( ! isupper( ' ' ) );
    TESTCASE( ! isupper( '@' ) );
    return TEST_RESULTS;
}